

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeConstraint.cpp
# Opt level: O3

void __thiscall UnitTest::TimeConstraint::~TimeConstraint(TimeConstraint *this)

{
  TestResults *this_00;
  TestDetails *test;
  ostream *poVar1;
  TestResults **ppTVar2;
  char *failure;
  double dVar3;
  MemoryOutStream stream;
  undefined1 local_1a8 [408];
  
  dVar3 = Timer::GetTimeInMs(&this->m_timer);
  if ((double)this->m_maxMs < dVar3) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Time constraint failed. Expected to run test under ",0x33);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,this->m_maxMs);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ms but took ",0xc);
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"ms.",3);
    ppTVar2 = CurrentTest::Results();
    this_00 = *ppTVar2;
    test = this->m_details;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
    TestResults::OnTestFailure(this_00,test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1a8,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x90));
  }
  return;
}

Assistant:

TimeConstraint::~TimeConstraint()
{
    double const totalTimeInMs = m_timer.GetTimeInMs();
    if (totalTimeInMs > m_maxMs)
    {
        MemoryOutStream stream;
        stream << "Time constraint failed. Expected to run test under " << m_maxMs <<
                  "ms but took " << totalTimeInMs << "ms.";

		UnitTest::CurrentTest::Results()->OnTestFailure(m_details, stream.GetText());
    }
}